

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

void __thiscall
CoreML::TreeEnsembleBase::setDefaultPredictionValue
          (TreeEnsembleBase *this,vector<double,_std::allocator<double>_> *v)

{
  double dVar1;
  pointer pdVar2;
  TreeEnsembleParameters *pTVar3;
  pointer pdVar4;
  int iVar5;
  pointer pdVar6;
  
  pTVar3 = this->tree_parameters;
  (pTVar3->basepredictionvalue_).current_size_ = 0;
  pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar6 = pdVar4;
  if (pdVar4 != pdVar2) {
    do {
      dVar1 = *pdVar4;
      pTVar3 = this->tree_parameters;
      iVar5 = (pTVar3->basepredictionvalue_).current_size_;
      if (iVar5 == (pTVar3->basepredictionvalue_).total_size_) {
        google::protobuf::RepeatedField<double>::Reserve(&pTVar3->basepredictionvalue_,iVar5 + 1);
        iVar5 = (pTVar3->basepredictionvalue_).current_size_;
      }
      (pTVar3->basepredictionvalue_).current_size_ = iVar5 + 1;
      ((pTVar3->basepredictionvalue_).rep_)->elements[iVar5] = dVar1;
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    pTVar3 = this->tree_parameters;
    pdVar4 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  pTVar3->numpredictiondimensions_ = (long)pdVar4 - (long)pdVar6 >> 3;
  return;
}

Assistant:

void TreeEnsembleBase::setDefaultPredictionValue(const std::vector<double>& v) {
        tree_parameters->clear_basepredictionvalue();
        for(double e : v) {
            tree_parameters->add_basepredictionvalue(e);
        }

        tree_parameters->set_numpredictiondimensions(v.size());
    }